

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxseparate.cpp
# Opt level: O0

void save_vox_scene(char *pcFilename,ogt_vox_scene *scene)

{
  uint8_t *__ptr;
  FILE *__s;
  FILE *fp;
  uint8_t *buffer;
  ogt_vox_scene *poStack_18;
  uint32_t buffersize;
  ogt_vox_scene *scene_local;
  char *pcFilename_local;
  
  buffer._4_4_ = 0;
  poStack_18 = scene;
  scene_local = (ogt_vox_scene *)pcFilename;
  __ptr = ogt_vox_write_scene(scene,(uint32_t *)((long)&buffer + 4));
  if (__ptr != (uint8_t *)0x0) {
    __s = (FILE *)open_file((char *)scene_local,"wb");
    if (__s == (FILE *)0x0) {
      ogt_vox_free(__ptr);
    }
    else {
      fwrite(__ptr,(ulong)buffer._4_4_,1,__s);
      fclose(__s);
      ogt_vox_free(__ptr);
    }
  }
  return;
}

Assistant:

void save_vox_scene(const char* pcFilename, const ogt_vox_scene* scene)
{
    // save the scene back out.
    uint32_t buffersize = 0;
    uint8_t* buffer = ogt_vox_write_scene(scene, &buffersize);
    if (!buffer)
        return;

    // open the file for write
    FILE * fp = open_file(pcFilename, "wb");
    if (!fp) {
        ogt_vox_free(buffer);
        return;
    }

    fwrite(buffer, buffersize, 1, fp);
    fclose(fp);
    ogt_vox_free(buffer);
}